

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

void __thiscall nvim::Nvim::async_paste(Nvim *this,string *data,bool crlf,Integer phase)

{
  allocator local_49;
  string local_48;
  Integer local_28;
  Integer phase_local;
  string *psStack_18;
  bool crlf_local;
  string *data_local;
  Nvim *this_local;
  
  local_28 = phase;
  phase_local._7_1_ = crlf;
  psStack_18 = data;
  data_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"nvim_paste",&local_49);
  NvimRPC::async_call<std::__cxx11::string,bool,long>
            (&this->client_,&local_48,psStack_18,(bool *)((long)&phase_local + 7),&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

void Nvim::async_paste(const std::string& data, bool crlf, Integer phase) {
    client_.async_call("nvim_paste", data, crlf, phase);
}